

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

void __thiscall
czh::token::Token::Token<std::__cxx11::string>
          (Token *this,TokenType type_,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *what_,Pos *pos_)

{
  Pos *pos__local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *what__local;
  TokenType type__local;
  Token *this_local;
  
  this->type = type_;
  czh::value::Value::
  Value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (&this->what,what_);
  Pos::Pos(&this->pos,pos_);
  return;
}

Assistant:

Token(TokenType type_, T what_, Pos pos_)
        :type(type_), what(std::move(what_)), pos(std::move(pos_)) {}